

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode JsTTDRawBufferModifySyncIndirect(JsValueRef buffer,size_t index,size_t count)

{
  ScriptContext *scriptContext;
  JsrtContext *pJVar1;
  JsErrorCode JVar2;
  void *unaff_retaddr;
  undefined1 auStack_a8 [8];
  ScriptEntryExitRecord __entryExitRecord;
  EnterScriptObject __enterScriptObject;
  AutoNestedHandledExceptionType local_2c [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  JVar2 = JsErrorInvalidArgument;
  if ((count | index) >> 0x20 == 0) {
    __enterScriptObject.library = (JavascriptLibrary *)0x0;
    pJVar1 = JsrtContext::GetCurrent();
    JVar2 = JsErrorNoCurrentContext;
    if (pJVar1 != (JsrtContext *)0x0) {
      scriptContext =
           (((pJVar1->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                (local_2c,ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
      __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
      __entryExitRecord.scriptContext = (ScriptContext *)0x0;
      __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
      __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
      auStack_a8 = (undefined1  [8])0x0;
      __entryExitRecord._0_1_ = 0;
      __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
      __entryExitRecord._2_6_ = 0;
      __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
      Js::EnterScriptObject::EnterScriptObject
                ((EnterScriptObject *)&__entryExitRecord.handledExceptionType,scriptContext,
                 (ScriptEntryExitRecord *)auStack_a8,unaff_retaddr,&stack0x00000000,true,true,true);
      Js::ScriptContext::OnScriptStart(scriptContext,true,true);
      Js::EnterScriptObject::VerifyEnterScript
                ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
      if (scriptContext->TTDShouldPerformRecordAction == true) {
        TTD::EventLog::RecordJsRTRawBufferModifySync
                  (scriptContext->threadContext->TTDLog,
                   (TTDJsRTActionResultAutoRecorder *)&__enterScriptObject.library,buffer,
                   (uint32)index,(uint32)count);
      }
      Js::EnterScriptObject::~EnterScriptObject
                ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_2c);
      JVar2 = JsNoError;
    }
    if (__enterScriptObject.library != (JavascriptLibrary *)0x0) {
      if (*(int *)((long)&((__enterScriptObject.library)->super_JavascriptLibraryBase).
                          super_FinalizableObject.super_IRecyclerVisitedObject.
                          _vptr_IRecyclerVisitedObject + 4) != -1) {
        TTDAbort_unrecoverable_error("Hmm this got changed somewhere???");
      }
      *(JsErrorCode *)
       ((long)&((__enterScriptObject.library)->super_JavascriptLibraryBase).super_FinalizableObject.
               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 4) = JVar2;
    }
  }
  return JVar2;
}

Assistant:

CHAKRA_API JsTTDRawBufferModifySyncIndirect(_In_ JsValueRef buffer, _In_ size_t index, _In_ size_t count)
{
#if !ENABLE_TTD
    return JsErrorCategoryUsage;
#else
    if(index > UINT32_MAX || count > UINT32_MAX)
    {
        return JsErrorInvalidArgument;
    }

    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTRawBufferModifySync, buffer, (uint32)index, (uint32)count);

        return JsNoError;
    });
#endif
}